

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar2 = &this->field_0xb0 + *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar2 + -0xb0) = 0x8dbd30;
  *(undefined8 *)((long)pvVar2 + 0x18) = 0x8dbdd0;
  *(undefined8 *)((long)pvVar2 + -0xa0) = 0x8dbd58;
  *(undefined8 *)((long)pvVar2 + -0x40) = 0x8dbd80;
  *(undefined8 *)((long)pvVar2 + -0x30) = 0x8dbda8;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *puVar1 = 0x8dbf48;
  puVar1[0x19] = 0x8dbf98;
  puVar1[2] = 0x8dbf70;
  if ((undefined8 *)puVar1[9] != puVar1 + 0xb) {
    operator_delete((undefined8 *)puVar1[9]);
  }
  if ((void *)puVar1[6] != (void *)0x0) {
    operator_delete((void *)puVar1[6]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}